

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O0

void insert_after_pos(internal_binding_t *binding,internal_binding_t *pos)

{
  internal_binding_t *pos_local;
  internal_binding_t *binding_local;
  
  setInternalBindingAddressPointer(binding->user_binding->function_handle,pos->wrappee_pointer);
  setInternalBindingAddressPointer
            (pos->user_binding->function_handle,binding->user_binding->wrapper_pointer);
  binding->next_binding = pos->next_binding;
  pos->next_binding = binding;
  return;
}

Assistant:

static void insert_after_pos(struct internal_binding_t *binding,
                             struct internal_binding_t *pos) {
  setInternalBindingAddressPointer(binding->user_binding->function_handle,
                                   pos->wrappee_pointer);
  setInternalBindingAddressPointer(pos->user_binding->function_handle,
                                   binding->user_binding->wrapper_pointer);
  binding->next_binding = pos->next_binding;
  pos->next_binding = binding;
}